

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

lu_mem markbeingfnz(global_State *g)

{
  lu_mem lVar1;
  GCObject *o;
  
  o = (GCObject *)&g->tobefnz;
  lVar1 = 0;
  while (o = o->next, o != (GCObject *)0x0) {
    if ((o->marked & 0x18) != 0) {
      reallymarkobject(g,o);
    }
    lVar1 = lVar1 + 1;
  }
  return lVar1;
}

Assistant:

static lu_mem markbeingfnz (global_State *g) {
  GCObject *o;
  lu_mem count = 0;
  for (o = g->tobefnz; o != NULL; o = o->next) {
    count++;
    markobject(g, o);
  }
  return count;
}